

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::RenderHeatmap<long_long,ImPlot::TransformerLogLin>
               (TransformerLogLin transformer,ImDrawList *DrawList,longlong *values,int rows,
               int cols,double scale_min,double scale_max,char *fmt,ImPlotPoint *bounds_min,
               ImPlotPoint *bounds_max)

{
  ImPlotPlot *pIVar1;
  ImVec2 IVar2;
  ImPlotContext *pIVar3;
  ImPlotContext *pIVar4;
  ImPlotContext *pIVar5;
  longlong *plVar6;
  ImDrawList *this;
  ImU32 col;
  int iVar7;
  int iVar8;
  long lVar9;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  ImVec4 IVar18;
  ImVec2 a;
  ImVec2 b;
  ImVec4 color;
  ImVec2 local_f8;
  int local_ec;
  undefined1 local_e8 [16];
  longlong *local_d0;
  char *local_c8;
  double local_c0;
  double local_b8;
  ImDrawList *local_b0;
  ulong local_a8;
  double local_a0;
  undefined8 local_98;
  undefined1 local_88 [24];
  double local_70;
  double local_68;
  ImVec2 local_60;
  ImVec4 local_58 [2];
  
  pIVar3 = GImPlot;
  dVar11 = (bounds_max->x - bounds_min->x) / (double)cols;
  dVar12 = (bounds_max->y - bounds_min->y) / (double)rows;
  dVar15 = dVar11 * 0.5;
  local_b8 = scale_max - scale_min;
  local_a8 = (ulong)(uint)cols;
  local_d0 = values;
  local_c8 = fmt;
  local_c0 = scale_min;
  local_b0 = DrawList;
  local_a0 = dVar11;
  if (0 < rows) {
    dVar16 = dVar12 * 0.5;
    iVar7 = 0;
    local_70 = dVar12 * 0.5;
    dVar10 = dVar11 * 0.5;
    dVar17 = 0.0;
    iVar8 = 0;
    local_98 = dVar16;
    do {
      plVar6 = local_d0;
      if (0 < cols) {
        dVar13 = dVar12 * dVar17 + local_70;
        dVar14 = 0.0;
        lVar9 = 0;
        local_ec = iVar8;
        local_68 = dVar17;
        do {
          pIVar4 = GImPlot;
          local_e8._0_8_ = dVar14;
          dVar11 = dVar14 * dVar11 + bounds_min->x + dVar10;
          local_88._0_8_ = dVar11;
          dVar14 = bounds_max->y - dVar13;
          dVar17 = log10((dVar11 - dVar15) / (GImPlot->CurrentPlot->XAxis).Range.Min);
          pIVar5 = GImPlot;
          pIVar1 = pIVar4->CurrentPlot;
          dVar11 = (pIVar1->XAxis).Range.Min;
          local_f8.y = (float)(((dVar14 - dVar16) - pIVar1->YAxis[transformer.YAxis].Range.Min) *
                               pIVar4->My[transformer.YAxis] +
                              (double)pIVar4->PixelRange[transformer.YAxis].Min.y);
          local_f8.x = (float)((((double)(float)(dVar17 / pIVar4->LogDenX) *
                                 ((pIVar1->XAxis).Range.Max - dVar11) + dVar11) - dVar11) *
                               pIVar4->Mx + (double)pIVar4->PixelRange[transformer.YAxis].Min.x);
          dVar14 = dVar14 + local_98;
          dVar16 = log10(((double)local_88._0_8_ + dVar15) / (GImPlot->CurrentPlot->XAxis).Range.Min
                        );
          this = local_b0;
          pIVar1 = pIVar5->CurrentPlot;
          dVar11 = (pIVar1->XAxis).Range.Min;
          local_60.y = (float)((dVar14 - pIVar1->YAxis[transformer.YAxis].Range.Min) *
                               pIVar5->My[transformer.YAxis] +
                              (double)pIVar5->PixelRange[transformer.YAxis].Min.y);
          local_60.x = (float)((((double)(float)(dVar16 / pIVar5->LogDenX) *
                                 ((pIVar1->XAxis).Range.Max - dVar11) + dVar11) - dVar11) *
                               pIVar5->Mx + (double)pIVar5->PixelRange[transformer.YAxis].Min.x);
          IVar18 = LerpColormap((float)(((double)plVar6[iVar7 + lVar9] - local_c0) / local_b8 + 0.0)
                               );
          local_58[0].w = IVar18.w;
          local_58[0]._0_12_ = IVar18._0_12_;
          local_58[0].w = (pIVar3->Style).FillAlpha * local_58[0].w;
          col = ImGui::GetColorU32(local_58);
          ImDrawList::AddRectFilled(this,&local_f8,&local_60,col,0.0,0xf);
          dVar14 = (double)local_e8._0_8_ + 1.0;
          lVar9 = lVar9 + 1;
          dVar11 = local_a0;
          dVar16 = local_98;
        } while ((int)local_a8 != (int)lVar9);
        iVar7 = iVar7 + (int)lVar9;
        dVar17 = local_68;
        iVar8 = local_ec;
      }
      dVar17 = dVar17 + 1.0;
      iVar8 = iVar8 + 1;
    } while (iVar8 != rows);
  }
  if (0 < rows && local_c8 != (char *)0x0) {
    iVar8 = 0;
    dVar16 = 0.0;
    iVar7 = 0;
    do {
      plVar6 = local_d0;
      if (0 < cols) {
        dVar17 = 0.0;
        lVar9 = 0;
        do {
          pIVar3 = GImPlot;
          local_e8._0_8_ = (bounds_min->y + 1.0) - (dVar12 * dVar16 + dVar12 * 0.5);
          dVar10 = log10((dVar17 * dVar11 + bounds_min->x + dVar15) /
                         (GImPlot->CurrentPlot->XAxis).Range.Min);
          pIVar1 = pIVar3->CurrentPlot;
          dVar11 = (pIVar1->XAxis).Range.Min;
          dVar11 = (((double)(float)(dVar10 / pIVar3->LogDenX) *
                     ((pIVar1->XAxis).Range.Max - dVar11) + dVar11) - dVar11) * pIVar3->Mx +
                   (double)pIVar3->PixelRange[transformer.YAxis].Min.x;
          local_98 = (double)CONCAT44((int)((ulong)dVar11 >> 0x20),(float)dVar11);
          local_e8 = ZEXT416((uint)(float)(((double)local_e8._0_8_ -
                                           pIVar1->YAxis[transformer.YAxis].Range.Min) *
                                           pIVar3->My[transformer.YAxis] +
                                          (double)pIVar3->PixelRange[transformer.YAxis].Min.y));
          sprintf((char *)local_58,local_c8,plVar6[iVar8 + lVar9]);
          IVar2 = ImGui::CalcTextSize((char *)local_58,(char *)0x0,false,-1.0);
          local_88._8_4_ = extraout_XMM0_Dc;
          local_88._0_4_ = IVar2.x;
          local_88._4_4_ = IVar2.y;
          local_88._12_4_ = extraout_XMM0_Dd;
          IVar18 = LerpColormap((float)(((double)plVar6[iVar8 + lVar9] - local_c0) / local_b8 + 0.0)
                               );
          local_f8.x = (float)local_98 - (float)local_88._0_4_ * 0.5;
          local_f8.y = (float)local_e8._0_4_ - (float)local_88._4_4_ * 0.5;
          ImDrawList::AddText(local_b0,&local_f8,
                              -(uint)(IVar18.z * 0.114 + IVar18.x * 0.299 + IVar18.y * 0.587 <= 0.5)
                              | 0xff000000,(char *)local_58,(char *)0x0);
          dVar17 = dVar17 + 1.0;
          lVar9 = lVar9 + 1;
          dVar11 = local_a0;
        } while ((int)local_a8 != (int)lVar9);
        iVar8 = iVar8 + (int)lVar9;
      }
      dVar16 = dVar16 + 1.0;
      iVar7 = iVar7 + 1;
    } while (iVar7 != rows);
  }
  return;
}

Assistant:

void RenderHeatmap(Transformer transformer, ImDrawList& DrawList, const T* values, int rows, int cols, double scale_min, double scale_max, const char* fmt, const ImPlotPoint& bounds_min, const ImPlotPoint& bounds_max) {
    ImPlotContext& gp = *GImPlot;
    const double w = (bounds_max.x - bounds_min.x) / cols;
    const double h = (bounds_max.y - bounds_min.y) / rows;
    const ImPlotPoint half_size(w*0.5,h*0.5);
    int i = 0;
    for (int r = 0; r < rows; ++r) {
        for (int c = 0; c < cols; ++c) {
            ImPlotPoint p;
            p.x = bounds_min.x + 0.5*w + c*w;
            p.y = bounds_max.y - (0.5*h + r*h);
            ImVec2 a  = transformer(ImPlotPoint(p.x - half_size.x, p.y - half_size.y));
            ImVec2 b  = transformer(ImPlotPoint(p.x + half_size.x, p.y + half_size.y));
            double t = ImRemap((double)values[i], scale_min, scale_max, 0.0, 1.0);
            ImVec4 color = LerpColormap((float)t);
            color.w *= gp.Style.FillAlpha;
            ImU32 col = ImGui::GetColorU32(color);
            DrawList.AddRectFilled(a, b, col);
            i++;
        }
    }
    if (fmt != NULL) {
        i = 0;
        for (int r = 0; r < rows; ++r) {
            for (int c = 0; c < cols; ++c) {
                ImPlotPoint p;
                p.x = bounds_min.x + 0.5*w + c*w;
                p.y = bounds_min.y + 1 - (0.5*h + r*h);
                ImVec2 px = transformer(p);
                char buff[32];
                sprintf(buff, fmt, values[i]);
                ImVec2 size = ImGui::CalcTextSize(buff);
                double t = ImRemap((double)values[i], scale_min, scale_max, 0.0, 1.0);
                ImVec4 color = LerpColormap((float)t);
                ImU32 col = CalcTextColor(color);
                DrawList.AddText(px - size * 0.5f, col, buff);
                i++;
            }
        }
    }
}